

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O0

string * __thiscall ArgsManager::GetChainTypeString_abi_cxx11_(ArgsManager *this)

{
  long lVar1;
  add_pointer_t<ChainType> ptVar2;
  string *in_RDI;
  long in_FS_OFFSET;
  ArgsManager *in_stack_00000028;
  type *parsed;
  variant<ChainType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  arg;
  variant<ChainType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff88;
  string *__str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  ChainType in_stack_ffffffffffffffdc;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __str = in_RDI;
  GetChainArg_abi_cxx11_(in_stack_00000028);
  ptVar2 = std::get_if<ChainType,ChainType,std::__cxx11::string>(in_stack_ffffffffffffff88);
  if (ptVar2 == (add_pointer_t<ChainType>)0x0) {
    std::get<std::__cxx11::string,ChainType,std::__cxx11::string>(in_stack_ffffffffffffff88);
    std::__cxx11::string::string(in_stack_ffffffffffffffd0,__str);
  }
  else {
    ChainTypeToString_abi_cxx11_(in_stack_ffffffffffffffdc);
  }
  std::
  variant<ChainType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~variant(in_stack_ffffffffffffff88);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::string ArgsManager::GetChainTypeString() const
{
    auto arg = GetChainArg();
    if (auto* parsed = std::get_if<ChainType>(&arg)) return ChainTypeToString(*parsed);
    return std::get<std::string>(arg);
}